

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_var::dump(statement_var *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  char *pcVar2;
  ostream *in_RDI;
  iterator unaff_retaddr;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffd8;
  
  poVar1 = in_RDI;
  std::operator<<(in_RSI,"< Var: ");
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffffd8);
  compiler_type::dump_expr(unaff_retaddr,poVar1);
  pcVar2 = "";
  if (((byte)in_RDI[0x28] & 1) != 0) {
    pcVar2 = ", type = link";
  }
  poVar1 = std::operator<<(in_RSI,pcVar2);
  std::operator<<(poVar1," >\n");
  return;
}

Assistant:

void statement_var::dump(std::ostream &o) const
	{
		o << "< Var: ";
		compiler_type::dump_expr(mTree.root(), o);
		o << (link ? ", type = link" : "") << " >\n";
	}